

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall QTreeView::collapse(QTreeView *this,QModelIndex *index)

{
  QTreeViewPrivate *this_00;
  bool bVar1;
  int item;
  QWidget *this_01;
  long in_FS_OFFSET;
  QPersistentModelIndex QStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  bVar1 = QAbstractItemViewPrivate::isIndexValid(&this_00->super_QAbstractItemViewPrivate,index);
  if (bVar1) {
    bVar1 = QTreeViewPrivate::isIndexExpanded(this_00,index);
    if (bVar1) {
      QBasicTimer::stop();
      if ((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout != true) {
        item = QTreeViewPrivate::viewIndex(this_00,index);
        if (item != -1) {
          QTreeViewPrivate::collapse(this_00,item,true);
          if ((this_00->super_QAbstractItemViewPrivate).state != AnimatingState) {
            (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                   super_QFrame.super_QWidget + 0x268))(this);
            this_01 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
              QWidget::update(this_01);
              return;
            }
            goto LAB_0053fda8;
          }
          goto LAB_0053fd8b;
        }
      }
      bVar1 = QAbstractItemViewPrivate::isPersistent(&this_00->super_QAbstractItemViewPrivate,index)
      ;
      if (bVar1) {
        QPersistentModelIndex::QPersistentModelIndex(&QStack_38,index);
        bVar1 = QHash<QPersistentModelIndex,_QHashDummyValue>::removeImpl<QPersistentModelIndex>
                          (&(this_00->expandedIndexes).q_hash,&QStack_38);
        QPersistentModelIndex::~QPersistentModelIndex(&QStack_38);
        if (bVar1) {
          collapsed(this,index);
        }
      }
    }
  }
LAB_0053fd8b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_0053fda8:
  __stack_chk_fail();
}

Assistant:

void QTreeView::collapse(const QModelIndex &index)
{
    Q_D(QTreeView);
    if (!d->isIndexValid(index))
        return;
    if (!d->isIndexExpanded(index))
        return;
    //if the current item is now invisible, the autoscroll will expand the tree to see it, so disable the autoscroll
    d->delayedAutoScroll.stop();

    if (d->delayedPendingLayout) {
        //A complete relayout is going to be performed, just un-store the expanded index, no need to layout.
        if (d->isPersistent(index) && d->expandedIndexes.remove(index))
            emit collapsed(index);
        return;
    }
    int i = d->viewIndex(index);
    if (i != -1) { // is visible
        d->collapse(i, true);
        if (!d->isAnimating()) {
            updateGeometries();
            viewport()->update();
        }
    } else {
        if (d->isPersistent(index) && d->expandedIndexes.remove(index))
            emit collapsed(index);
    }
}